

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::FunctionCallArgs(SQCompiler *this,bool rawcall)

{
  SQLexer *this_00;
  SQFuncState *this_01;
  undefined2 uVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  SQInstruction local_38;
  
  this_00 = &this->_lex;
  if (this->_token == 0x29) {
    SVar2 = SQLexer::Lex(this_00);
    this->_token = SVar2;
    lVar5 = 1;
    if (!rawcall) goto LAB_0011e424;
LAB_0011e3ee:
    Error(this,"rawcall requires at least 2 parameters (callee and this)");
    lVar8 = lVar5;
LAB_0011e3ff:
    lVar5 = lVar8 + -2;
    if (lVar8 < 4) goto LAB_0011e424;
  }
  else {
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      Expression(this);
      MoveIfCurrentTargetIsLocal(this);
      lVar5 = this->_token;
      if (lVar5 == 0x2c) {
        lVar5 = SQLexer::Lex(this_00);
        this->_token = lVar5;
        if (lVar5 == 0x29) {
          Error(this,"expression expected, found \')\'");
          lVar5 = this->_token;
        }
      }
      uVar7 = uVar6 + 1;
    } while (lVar5 != 0x29);
    SVar2 = SQLexer::Lex(this_00);
    this->_token = SVar2;
    lVar5 = uVar6 + 2;
    if (rawcall) {
      lVar8 = lVar5;
      if (uVar7 < 2) goto LAB_0011e3ee;
      goto LAB_0011e3ff;
    }
  }
  lVar8 = 1;
  do {
    SQFuncState::PopTarget(this->_fs);
    lVar8 = lVar8 + 1;
  } while (lVar5 != lVar8);
LAB_0011e424:
  SVar2 = SQFuncState::PopTarget(this->_fs);
  SVar3 = SQFuncState::PopTarget(this->_fs);
  this_01 = this->_fs;
  SVar4 = SQFuncState::PushTarget(this_01,-1);
  local_38._arg0 = (uchar)SVar4;
  local_38._0_5_ = 0x600000000;
  uVar1 = local_38._4_2_;
  local_38.op = (char)uVar1;
  local_38._arg0 = (char)((ushort)uVar1 >> 8);
  local_38._arg1 = (int)SVar3;
  local_38._arg2 = (uchar)SVar2;
  local_38._arg3 = (uchar)lVar5;
  SQFuncState::AddInstruction(this_01,&local_38);
  return;
}

Assistant:

void FunctionCallArgs(bool rawcall = false)
    {
        SQInteger nargs = 1;//this
         while(_token != _SC(')')) {
             Expression();
             MoveIfCurrentTargetIsLocal();
             nargs++;
             if(_token == _SC(',')){
                 Lex();
                 if(_token == ')') Error(_SC("expression expected, found ')'"));
             }
         }
         Lex();
         if (rawcall) {
             if (nargs < 3) Error(_SC("rawcall requires at least 2 parameters (callee and this)"));
             nargs -= 2; //removes callee and this from count
         }
         for(SQInteger i = 0; i < (nargs - 1); i++) _fs->PopTarget();
         SQInteger stackbase = _fs->PopTarget();
         SQInteger closure = _fs->PopTarget();
         _fs->AddInstruction(_OP_CALL, _fs->PushTarget(), closure, stackbase, nargs);
    }